

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::on_torrent_aborted(torrent *this)

{
  alert_manager *this_00;
  info_hash_t *args_1;
  client_data_t local_40 [2];
  _Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> local_10;
  torrent *this_local;
  
  local_10._M_head_impl = (hash_picker *)this;
  storage_holder::reset(&this->m_storage);
  this_00 = alerts(this);
  get_handle((torrent *)&stack0xffffffffffffffe0);
  args_1 = info_hash(this);
  local_40[0] = get_userdata(this);
  alert_manager::
  emplace_alert<libtorrent::torrent_removed_alert,libtorrent::torrent_handle,libtorrent::info_hash_t_const&,libtorrent::client_data_t>
            (this_00,(torrent_handle *)&stack0xffffffffffffffe0,args_1,local_40);
  torrent_handle::~torrent_handle((torrent_handle *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void torrent::on_torrent_aborted()
	{
		TORRENT_ASSERT(is_single_thread());

		// there should be no more disk activity for this torrent now, we can
		// release the disk io handle
		m_storage.reset();

		alerts().emplace_alert<torrent_removed_alert>(get_handle()
			, info_hash(), get_userdata());
	}